

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::EOR_ID_Y(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  byte bVar4;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  uVar3 = ReadWord(this,(ushort)bVar1);
  bVar2 = ReadByte(this,this->Y + uVar3);
  bVar1 = this->A;
  bVar4 = bVar1 ^ bVar2;
  this->A = bVar4;
  (this->field_6).ps = bVar4 & 0x80 | (bVar1 == bVar2) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_ID_Y()
{
    cycles = 5;
    A ^= ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}